

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * exprDup(sqlite3 *db,Expr *p,int dupFlags,u8 **pzBuffer)

{
  uint uVar1;
  uint uVar2;
  u8 **ppuVar3;
  sqlite3 *db_00;
  uint uVar4;
  int iVar5;
  Expr *pOwner;
  Select *pSVar6;
  Expr *pEVar7;
  Window *pWVar8;
  size_t __n;
  u32 uVar9;
  uint uVar10;
  u8 *local_50;
  uint local_44;
  u8 **local_40;
  sqlite3 *local_38;
  
  if (pzBuffer == (u8 **)0x0) {
    iVar5 = dupedExprSize(p,dupFlags);
    pOwner = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar5);
    local_44 = 0;
  }
  else {
    pOwner = (Expr *)*pzBuffer;
    local_44 = 0x8000000;
  }
  if (pOwner != (Expr *)0x0) {
    local_40 = pzBuffer;
    local_38 = db;
    uVar4 = dupedExprStructSize(p,dupFlags);
    uVar1 = p->flags;
    uVar10 = 0;
    if (((uVar1 >> 10 & 1) == 0) && (uVar10 = 0, (p->u).zToken != (char *)0x0)) {
      iVar5 = sqlite3Strlen30((p->u).zToken);
      uVar10 = iVar5 + 1;
    }
    if (dupFlags == 0) {
      uVar2 = 0x2c;
      if ((uVar1 >> 0xd & 1) == 0) {
        uVar2 = 0x48;
      }
      __n = 0x10;
      if ((uVar1 >> 0xe & 1) == 0) {
        __n = (size_t)uVar2;
      }
      memcpy(pOwner,p,__n);
      if ((uint)__n < 0x48) {
        memset(&pOwner->op + __n,0,0x48 - __n);
      }
    }
    else {
      memcpy(pOwner,p,(ulong)(uVar4 & 0xfff));
    }
    uVar9 = uVar4 & 0x6000 | local_44 | pOwner->flags & 0xf7fe9fff;
    pOwner->flags = uVar9;
    if (uVar10 != 0) {
      (pOwner->u).zToken = (char *)(&pOwner->op + (uVar4 & 0xfff));
      memcpy(&pOwner->op + (uVar4 & 0xfff),(p->u).zToken,(ulong)uVar10);
      uVar9 = pOwner->flags;
    }
    db_00 = local_38;
    if (((uVar9 | p->flags) & 0x804000) == 0) {
      if ((p->flags >> 0xb & 1) == 0) {
        pSVar6 = (Select *)sqlite3ExprListDup(local_38,(p->x).pList,dupFlags);
      }
      else {
        pSVar6 = sqlite3SelectDup(local_38,(Select *)(p->x).pList,dupFlags);
      }
      (pOwner->x).pList = (ExprList *)pSVar6;
    }
    uVar1 = pOwner->flags;
    if ((uVar1 & 0x1006000) == 0) {
      if ((p->flags & 0x804000) == 0) {
        pEVar7 = p->pLeft;
        if (pOwner->op != 0xaa) {
          pEVar7 = sqlite3ExprDup(db_00,pEVar7,0);
        }
        pOwner->pLeft = pEVar7;
        pEVar7 = sqlite3ExprDup(db_00,p->pRight,0);
        pOwner->pRight = pEVar7;
      }
    }
    else {
      iVar5 = dupedExprNodeSize(p,dupFlags);
      ppuVar3 = local_40;
      local_50 = &pOwner->op + iVar5;
      if ((uVar1 & 0x804000) == 0) {
        if (p->pLeft == (Expr *)0x0) {
          pEVar7 = (Expr *)0x0;
        }
        else {
          pEVar7 = exprDup(db_00,p->pLeft,1,&local_50);
        }
        pOwner->pLeft = pEVar7;
        if (p->pRight == (Expr *)0x0) {
          pEVar7 = (Expr *)0x0;
        }
        else {
          pEVar7 = exprDup(db_00,p->pRight,1,&local_50);
        }
        pOwner->pRight = pEVar7;
      }
      if ((p->flags & 0x1000000) != 0) {
        pWVar8 = sqlite3WindowDup(db_00,pOwner,(p->y).pWin);
        (pOwner->y).pWin = pWVar8;
      }
      if (ppuVar3 != (u8 **)0x0) {
        *ppuVar3 = local_50;
      }
    }
  }
  return pOwner;
}

Assistant:

static Expr *exprDup(sqlite3 *db, Expr *p, int dupFlags, u8 **pzBuffer){
  Expr *pNew;           /* Value to return */
  u8 *zAlloc;           /* Memory space from which to build Expr object */
  u32 staticFlag;       /* EP_Static if space not obtained from malloc */

  assert( db!=0 );
  assert( p );
  assert( dupFlags==0 || dupFlags==EXPRDUP_REDUCE );
  assert( pzBuffer==0 || dupFlags==EXPRDUP_REDUCE );

  /* Figure out where to write the new Expr structure. */
  if( pzBuffer ){
    zAlloc = *pzBuffer;
    staticFlag = EP_Static;
  }else{
    zAlloc = sqlite3DbMallocRawNN(db, dupedExprSize(p, dupFlags));
    staticFlag = 0;
  }
  pNew = (Expr *)zAlloc;

  if( pNew ){
    /* Set nNewSize to the size allocated for the structure pointed to
    ** by pNew. This is either EXPR_FULLSIZE, EXPR_REDUCEDSIZE or
    ** EXPR_TOKENONLYSIZE. nToken is set to the number of bytes consumed
    ** by the copy of the p->u.zToken string (if any).
    */
    const unsigned nStructSize = dupedExprStructSize(p, dupFlags);
    const int nNewSize = nStructSize & 0xfff;
    int nToken;
    if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
      nToken = sqlite3Strlen30(p->u.zToken) + 1;
    }else{
      nToken = 0;
    }
    if( dupFlags ){
      assert( ExprHasProperty(p, EP_Reduced)==0 );
      memcpy(zAlloc, p, nNewSize);
    }else{
      u32 nSize = (u32)exprStructSize(p);
      memcpy(zAlloc, p, nSize);
      if( nSize<EXPR_FULLSIZE ){ 
        memset(&zAlloc[nSize], 0, EXPR_FULLSIZE-nSize);
      }
    }

    /* Set the EP_Reduced, EP_TokenOnly, and EP_Static flags appropriately. */
    pNew->flags &= ~(EP_Reduced|EP_TokenOnly|EP_Static|EP_MemToken);
    pNew->flags |= nStructSize & (EP_Reduced|EP_TokenOnly);
    pNew->flags |= staticFlag;

    /* Copy the p->u.zToken string, if any. */
    if( nToken ){
      char *zToken = pNew->u.zToken = (char*)&zAlloc[nNewSize];
      memcpy(zToken, p->u.zToken, nToken);
    }

    if( 0==((p->flags|pNew->flags) & (EP_TokenOnly|EP_Leaf)) ){
      /* Fill in the pNew->x.pSelect or pNew->x.pList member. */
      if( ExprHasProperty(p, EP_xIsSelect) ){
        pNew->x.pSelect = sqlite3SelectDup(db, p->x.pSelect, dupFlags);
      }else{
        pNew->x.pList = sqlite3ExprListDup(db, p->x.pList, dupFlags);
      }
    }

    /* Fill in pNew->pLeft and pNew->pRight. */
    if( ExprHasProperty(pNew, EP_Reduced|EP_TokenOnly|EP_WinFunc) ){
      zAlloc += dupedExprNodeSize(p, dupFlags);
      if( !ExprHasProperty(pNew, EP_TokenOnly|EP_Leaf) ){
        pNew->pLeft = p->pLeft ?
                      exprDup(db, p->pLeft, EXPRDUP_REDUCE, &zAlloc) : 0;
        pNew->pRight = p->pRight ?
                       exprDup(db, p->pRight, EXPRDUP_REDUCE, &zAlloc) : 0;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_WinFunc) ){
        pNew->y.pWin = sqlite3WindowDup(db, pNew, p->y.pWin);
        assert( ExprHasProperty(pNew, EP_WinFunc) );
      }
#endif /* SQLITE_OMIT_WINDOWFUNC */
      if( pzBuffer ){
        *pzBuffer = zAlloc;
      }
    }else{
      if( !ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
        if( pNew->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->iColumn==0 || p->pRight==0 );
          assert( p->pRight==0  || p->pRight==p->pLeft );
        }else{
          pNew->pLeft = sqlite3ExprDup(db, p->pLeft, 0);
        }
        pNew->pRight = sqlite3ExprDup(db, p->pRight, 0);
      }
    }
  }
  return pNew;
}